

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVkImpl.hpp
# Opt level: O2

char * __thiscall Diligent::ShaderVkImpl::GetEntryPoint(ShaderVkImpl *this)

{
  string msg;
  
  if ((this->super_ShaderBase<Diligent::EngineVkImplTraits>).m_Status._M_i < SHADER_STATUS_READY) {
    FormatString<char[109]>
              (&msg,(char (*) [109])
                    "Shader resources are not available until the shader is compiled. Use GetStatus() to check the shader status."
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetEntryPoint",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/ShaderVkImpl.hpp"
               ,0x65);
    std::__cxx11::string::~string((string *)&msg);
  }
  return (this->m_EntryPoint)._M_dataplus._M_p;
}

Assistant:

const char* GetEntryPoint() const
    {
        DEV_CHECK_ERR(!IsCompiling(), "Shader resources are not available until the shader is compiled. Use GetStatus() to check the shader status.");
        return m_EntryPoint.c_str();
    }